

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpcollisionlist.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPCollisionList::Timeout
          (RTPCollisionList *this,RTPTime *currenttime,RTPTime *timeoutdelay)

{
  RTPAddress *obj;
  bool bVar1;
  reference pAVar2;
  RTPMemoryManager *mgr;
  const_iterator local_50;
  _List_node_base *local_48;
  _Self local_40;
  _List_node_base *local_38;
  RTPTime local_30;
  RTPTime checktime;
  iterator it;
  RTPTime *timeoutdelay_local;
  RTPTime *currenttime_local;
  RTPCollisionList *this_local;
  
  std::_List_iterator<jrtplib::RTPCollisionList::AddressAndTime>::_List_iterator
            ((_List_iterator<jrtplib::RTPCollisionList::AddressAndTime> *)&checktime);
  local_30 = (RTPTime)currenttime->m_t;
  RTPTime::operator-=(&local_30,timeoutdelay);
  local_38 = (_List_node_base *)
             std::__cxx11::
             list<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
             ::begin(&this->addresslist);
  checktime.m_t = (double)local_38;
  while( true ) {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
         ::end(&this->addresslist);
    bVar1 = std::operator!=((_Self *)&checktime,&local_40);
    if (!bVar1) break;
    pAVar2 = std::_List_iterator<jrtplib::RTPCollisionList::AddressAndTime>::operator*
                       ((_List_iterator<jrtplib::RTPCollisionList::AddressAndTime> *)&checktime);
    bVar1 = RTPTime::operator<(&pAVar2->recvtime,&local_30);
    if (bVar1) {
      pAVar2 = std::_List_iterator<jrtplib::RTPCollisionList::AddressAndTime>::operator*
                         ((_List_iterator<jrtplib::RTPCollisionList::AddressAndTime> *)&checktime);
      obj = pAVar2->addr;
      mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
      RTPDelete<jrtplib::RTPAddress>(obj,mgr);
      std::_List_const_iterator<jrtplib::RTPCollisionList::AddressAndTime>::_List_const_iterator
                (&local_50,(iterator *)&checktime);
      local_48 = (_List_node_base *)
                 std::__cxx11::
                 list<jrtplib::RTPCollisionList::AddressAndTime,_std::allocator<jrtplib::RTPCollisionList::AddressAndTime>_>
                 ::erase(&this->addresslist,local_50);
      checktime.m_t = (double)local_48;
    }
    else {
      std::_List_iterator<jrtplib::RTPCollisionList::AddressAndTime>::operator++
                ((_List_iterator<jrtplib::RTPCollisionList::AddressAndTime> *)&checktime,0);
    }
  }
  return;
}

Assistant:

void RTPCollisionList::Timeout(const RTPTime &currenttime,const RTPTime &timeoutdelay)
{
	std::list<AddressAndTime>::iterator it;
	RTPTime checktime = currenttime;
	checktime -= timeoutdelay;
	
	it = addresslist.begin();
	while(it != addresslist.end())
	{
		if ((*it).recvtime < checktime) // timeout
		{
			RTPDelete((*it).addr,GetMemoryManager());
			it = addresslist.erase(it);	
		}
		else
			it++;
	}
}